

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct_field_by_id
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  t_java_generator *this_00;
  string local_40;
  
  this_00 = (t_java_generator *)out;
  poVar1 = t_generator::indent((t_generator *)this,out);
  java_nullable_annotation_abi_cxx11_(&local_40,this_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"public _Fields fieldForId(int fieldId) {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  return _Fields.findByThriftId(fieldId);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"}");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_field_by_id(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << java_nullable_annotation() << endl;
  indent(out) << "public _Fields fieldForId(int fieldId) {" << endl;
  indent(out) << "  return _Fields.findByThriftId(fieldId);" << endl;
  indent(out) << "}" << endl << endl;
}